

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int mkdir_p(char *path)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  char mypath [4096];
  char cStack_1018;
  char local_1017 [4095];
  
  pcVar4 = &cStack_1018;
  sVar2 = strlen(path);
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (sVar2 < 0x1000) {
    strcpy(&cStack_1018,path);
    do {
      while( true ) {
        pcVar4 = pcVar4 + 1;
        if (*pcVar4 != '/') break;
        *pcVar4 = '\0';
        iVar1 = mkdir(&cStack_1018,0x1c0);
        if ((iVar1 != 0) && (*piVar3 != 0x11)) goto LAB_00105317;
        *pcVar4 = '/';
      }
    } while (*pcVar4 != '\0');
    iVar1 = mkdir(&cStack_1018,0x1c0);
    if ((iVar1 == 0) || (iVar1 = -1, *piVar3 == 0x11)) {
      iVar1 = 0;
    }
  }
  else {
    mkdir_p_cold_1();
LAB_00105317:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int mkdir_p(const char *path)
{
    const size_t len = strlen(path);
    char mypath[PATH_MAX];
    char *p;

    errno = 0;

    /* copy string so its mutable */
    if (len > sizeof(mypath)-1) {
        fprintf(stderr, "Output directory path too long\n");
        return -1;
    }

    strcpy(mypath, path);

    /* iterate the string */
    for (p = mypath + 1; *p; p++) {
        if (*p == '/') {
            /* temporarily truncate */
            *p = '\0';

            if (mkdir(mypath, S_IRWXU) != 0) {
                if (errno != EEXIST)
                    return -1;
            }
            *p = '/';
        }
    }

    if (mkdir(mypath, S_IRWXU) != 0) {
        if (errno != EEXIST)
            return -1;
    }

    return 0;
}